

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O1

BOOL SetCurrentDirectoryW(LPCWSTR lpPathName)

{
  bool bVar1;
  undefined8 lpPathName_00;
  int iVar2;
  BOOL BVar3;
  DWORD DVar4;
  size_t sVar5;
  DWORD dwErrCode;
  SIZE_T count;
  long in_FS_OFFSET;
  undefined1 local_70 [8];
  PathCharString dirPathString;
  
  dirPathString.m_count = *(SIZE_T *)(in_FS_OFFSET + 0x28);
  dirPathString._32_8_ = local_70;
  dirPathString.m_size = 0;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_002bc5b4;
  if (lpPathName == (LPCWSTR)0x0) {
    dwErrCode = 0x7b;
LAB_002bc525:
    bVar1 = false;
    BVar3 = 0;
  }
  else {
    sVar5 = PAL_wcslen(lpPathName);
    count = sVar5 * 3 + 3;
    StackString<32UL,_char>::Resize((StackString<32UL,_char> *)local_70,count);
    lpPathName_00 = dirPathString._32_8_;
    if (dirPathString._32_8_ == 0) {
      dwErrCode = 8;
      goto LAB_002bc525;
    }
    iVar2 = WideCharToMultiByte(0,0,lpPathName,-1,(LPSTR)dirPathString._32_8_,(int)count,(LPCSTR)0x0
                                ,(LPBOOL)0x0);
    if ((ulong)(long)iVar2 < dirPathString.m_size) {
      dirPathString.m_size = (long)iVar2;
    }
    *(undefined1 *)(dirPathString._32_8_ + dirPathString.m_size) = 0;
    if (iVar2 == 0) {
      DVar4 = GetLastError();
      if (DVar4 == 0x7a) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_002bc5b4;
        dwErrCode = 0xce;
        goto LAB_002bc525;
      }
      BVar3 = 0;
      fprintf(_stderr,"] %s %s:%d","SetCurrentDirectoryW",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/directory.cpp"
              ,0x1ed);
      dwErrCode = 0x54f;
      fprintf(_stderr,"WideCharToMultiByte failure! error is %d\n",(ulong)DVar4);
      bVar1 = false;
    }
    else {
      BVar3 = SetCurrentDirectoryA((LPCSTR)lpPathName_00);
      dwErrCode = 0;
      bVar1 = true;
    }
  }
  if (!bVar1) {
    SetLastError(dwErrCode);
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)local_70);
    if (*(SIZE_T *)(in_FS_OFFSET + 0x28) == dirPathString.m_count) {
      return BVar3;
    }
    __stack_chk_fail();
  }
LAB_002bc5b4:
  abort();
}

Assistant:

BOOL
PALAPI
SetCurrentDirectoryW(
            IN LPCWSTR lpPathName)
{
    BOOL bRet;
    DWORD dwLastError = 0;
    PathCharString dirPathString;
    int  size;
    size_t length;
    char * dir;
    
    PERF_ENTRY(SetCurrentDirectoryW);
    ENTRY("SetCurrentDirectoryW(lpPathName=%p (%S))\n",
          lpPathName?lpPathName:W16_NULLSTRING,
          lpPathName?lpPathName:W16_NULLSTRING);

   /*check if the given path is null. If so
     return FALSE*/
    if (lpPathName == NULL )
    {
        ERROR("Invalid path/directory name\n");
        dwLastError = ERROR_INVALID_NAME;
        bRet = FALSE;
        goto done;
    }

    length = (PAL_wcslen(lpPathName)+1) * 3;
    dir = dirPathString.OpenStringBuffer(length);
    if (NULL == dir)
    {
        dwLastError = ERROR_NOT_ENOUGH_MEMORY;
        bRet = FALSE;
        goto done;
    }
    
    size = WideCharToMultiByte( CP_ACP, 0, lpPathName, -1, dir, length,
                                NULL, NULL );
    dirPathString.CloseBuffer(size);
    
    if( size == 0 )
    {
        dwLastError = GetLastError();
        if( dwLastError == ERROR_INSUFFICIENT_BUFFER )
        {
            WARN("lpPathName is larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
            dwLastError = ERROR_FILENAME_EXCED_RANGE;
        }
        else
        {
            ASSERT("WideCharToMultiByte failure! error is %d\n", dwLastError);
            dwLastError = ERROR_INTERNAL_ERROR;
        }
        bRet = FALSE;
        goto done;
    }

    bRet = SetCurrentDirectoryA(dir);
done:
    if( dwLastError )
    {
        SetLastError(dwLastError);
    }

    LOGEXIT("SetCurrentDirectoryW returns BOOL %d\n", bRet);
    PERF_EXIT(SetCurrentDirectoryW);
    return bRet;
}